

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

void match_list_free(match_list *list)

{
  undefined8 *puVar1;
  undefined8 *in_RDI;
  match *q;
  match *p;
  undefined8 local_10;
  
  local_10 = (undefined8 *)*in_RDI;
  while (local_10 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_10;
    archive_mstring_clean((archive_mstring *)0x22f211);
    free(local_10);
    local_10 = puVar1;
  }
  return;
}

Assistant:

static void
match_list_free(struct match_list *list)
{
	struct match *p, *q;

	for (p = list->first; p != NULL; ) {
		q = p;
		p = p->next;
		archive_mstring_clean(&(q->pattern));
		free(q);
	}
}